

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O3

void gflags::anon_unknown_5::
     Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndThenFlagFile
     ::Run(void)

{
  int32 iVar1;
  undefined8 extraout_RAX;
  FlagSaver fs;
  FlagSaver local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  undefined8 local_10;
  
  FlagSaver::FlagSaver(&local_30);
  fprintf(_stderr,"Running test %s/%s\n","ParseCommandLineFlagsUsesLastDefinitionTest",
          "WhenFlagIsDefinedInCommandLineAndThenFlagFile");
  local_28 = "my_test";
  local_20 = "--test_flag=0";
  local_18 = GetFlagFileFlag();
  local_10 = 0;
  iVar1 = ParseTestFlag(true,3,&local_28);
  if (iVar1 == 2) {
    iVar1 = ParseTestFlag(false,3,&local_28);
    if (iVar1 == 2) {
      FlagSaver::~FlagSaver(&local_30);
      return;
    }
  }
  else {
    _GLOBAL__N_1::
    Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndThenFlagFile::
    Run();
  }
  _GLOBAL__N_1::
  Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndThenFlagFile::
  Run();
  FlagSaver::~FlagSaver(&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(ParseCommandLineFlagsUsesLastDefinitionTest,
     WhenFlagIsDefinedInCommandLineAndThenFlagFile) {
  const char* argv[] = {
    "my_test",
    "--test_flag=0",
    GetFlagFileFlag(),
    NULL,
  };

  EXPECT_EQ(2, ParseTestFlag(true, arraysize(argv) - 1, argv));
  EXPECT_EQ(2, ParseTestFlag(false, arraysize(argv) - 1, argv));
}